

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O2

void __thiscall IPAsirMiniSAT::~IPAsirMiniSAT(IPAsirMiniSAT *this)

{
  (this->super_SimpSolver).super_Solver._vptr_Solver = (_func_int **)&PTR__IPAsirMiniSAT_00138cf0;
  reset(this);
  Minisat::vec<Minisat::Lit>::~vec(&this->clause);
  Minisat::vec<Minisat::Lit>::~vec(&this->assumptions);
  Minisat::SimpSolver::~SimpSolver(&this->super_SimpSolver);
  return;
}

Assistant:

~IPAsirMiniSAT() { reset(); }